

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_info.cpp
# Opt level: O3

unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> __thiscall
duckdb::LoadInfo::Copy(LoadInfo *this)

{
  LoadType LVar1;
  bool bVar2;
  _func_int **pp_Var3;
  pointer pLVar4;
  pointer *__ptr;
  long in_RSI;
  
  pp_Var3 = (_func_int **)operator_new(0x80);
  *(undefined1 *)(pp_Var3 + 1) = 8;
  *pp_Var3 = (_func_int *)&PTR__LoadInfo_01977bb0;
  pp_Var3[2] = (_func_int *)(pp_Var3 + 4);
  pp_Var3[3] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var3 + 4) = 0;
  pp_Var3[6] = (_func_int *)(pp_Var3 + 8);
  pp_Var3[7] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var3 + 8) = 0;
  pp_Var3[0xb] = (_func_int *)(pp_Var3 + 0xd);
  pp_Var3[0xc] = (_func_int *)0x0;
  *(undefined1 *)(pp_Var3 + 0xd) = 0;
  (this->super_ParseInfo)._vptr_ParseInfo = pp_Var3;
  pLVar4 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      this);
  ::std::__cxx11::string::_M_assign((string *)&pLVar4->filename);
  pLVar4 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      this);
  ::std::__cxx11::string::_M_assign((string *)&pLVar4->repository);
  LVar1 = *(LoadType *)(in_RSI + 0x78);
  pLVar4 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      this);
  pLVar4->load_type = LVar1;
  bVar2 = *(bool *)(in_RSI + 0x50);
  pLVar4 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      this);
  pLVar4->repo_is_alias = bVar2;
  pLVar4 = unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true>::operator->
                     ((unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>,_true> *)
                      this);
  ::std::__cxx11::string::_M_assign((string *)&pLVar4->version);
  return (unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>_>)
         (unique_ptr<duckdb::LoadInfo,_std::default_delete<duckdb::LoadInfo>_>)this;
}

Assistant:

unique_ptr<LoadInfo> LoadInfo::Copy() const {
	auto result = make_uniq<LoadInfo>();
	result->filename = filename;
	result->repository = repository;
	result->load_type = load_type;
	result->repo_is_alias = repo_is_alias;
	result->version = version;
	return result;
}